

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshift.c
# Opt level: O2

void * mpt_qshift(mpt_queue *queue,size_t len,void *data)

{
  ulong in_RAX;
  void *__src;
  int *piVar1;
  size_t low;
  ulong local_38;
  
  local_38 = in_RAX;
  __src = mpt_queue_data(queue,&local_38);
  if (len < local_38 || len - local_38 == 0) {
    if (data != (void *)0x0) {
      memcpy(data,__src,len);
    }
LAB_001196d9:
    mpt_queue_crop(queue,0,len);
  }
  else {
    if (data == (void *)0x0) {
      piVar1 = __errno_location();
      *piVar1 = 0x16;
    }
    else {
      if (len <= queue->len) {
        memcpy(data,__src,local_38);
        memcpy((void *)(local_38 + (long)data),queue->base,len - local_38);
        __src = data;
        goto LAB_001196d9;
      }
      piVar1 = __errno_location();
      *piVar1 = 0x22;
    }
    __src = (void *)0x0;
  }
  return __src;
}

Assistant:

extern void *mpt_qshift(MPT_STRUCT(queue) *queue, size_t len, void *data)
{
	size_t low;
	uint8_t *addr;
	
	addr = mpt_queue_data(queue, &low);
	
	if (len <= low) {
		if (data) {
			(void) memcpy(data, addr, len);
		}
	}
	/* need data from both segments */
	else {
		if (!data) {
			errno = EINVAL;
			return 0;
		}
		if (len > queue->len) {
			errno = ERANGE;
			return 0;
		}
		addr = memcpy(data, addr, low);
		(void) memcpy(addr+low, queue->base, len-low);
	}
	/* remove data area from queue start */
	mpt_queue_crop(queue, 0, len);
	
	return addr;
}